

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

const_iterator * __thiscall
QMultiHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
          (const_iterator *__return_storage_ptr__,QMultiHash<QByteArray,_QByteArray> *this,
          QByteArray *key)

{
  Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *this_00;
  Data *pDVar1;
  Span *pSVar2;
  size_t hash;
  ulong uVar3;
  Bucket BVar4;
  QByteArrayView key_00;
  
  if (this->m_size != 0) {
    this_00 = this->d;
    key_00.m_data = (key->d).ptr;
    key_00.m_size = (key->d).size;
    hash = qHash(key_00,this_00->seed);
    BVar4 = QHashPrivate::Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::
            findBucketWithHash<QByteArray>(this_00,key,hash);
    if ((BVar4.span)->offsets[BVar4.index] != 0xff) {
      pDVar1 = this->d;
      pSVar2 = pDVar1->spans;
      uVar3 = ((ulong)((long)BVar4.span - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | BVar4.index;
      (__return_storage_ptr__->i).d = pDVar1;
      (__return_storage_ptr__->i).bucket = uVar3;
      __return_storage_ptr__->e = (Chain **)0x0;
      if (pDVar1 == (Data *)0x0) {
        return __return_storage_ptr__;
      }
      uVar3 = uVar3 >> 7;
      __return_storage_ptr__->e =
           (Chain **)
           (pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)BVar4.index & 0x7f]].storage.data +
           0x18);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->i).d = (Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)0x0;
  (__return_storage_ptr__->i).bucket = 0;
  __return_storage_ptr__->e = (Chain **)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return constEnd();
        return const_iterator(it.toIterator(d));
    }